

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

string * __thiscall
slang::SVInt::toString_abi_cxx11_
          (SVInt *this,LiteralBase base,bool includeBase,bitwidth_t abbreviateThresholdBits)

{
  allocator<char> *__a;
  byte in_CL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  SmallVector<char,_40UL> buffer;
  bitwidth_t in_stack_000001e0;
  bool in_stack_000001e6;
  LiteralBase in_stack_000001e7;
  SmallVectorBase<char> *in_stack_000001e8;
  SVInt *in_stack_000001f0;
  allocator<char> *__end;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_65 [13];
  SmallVectorBase<char> local_58 [2];
  byte local_12;
  
  local_12 = in_CL & 1;
  this_00 = in_RDI;
  SmallVector<char,_40UL>::SmallVector((SmallVector<char,_40UL> *)0x586a9c);
  writeTo(in_stack_000001f0,in_stack_000001e8,in_stack_000001e7,in_stack_000001e6,in_stack_000001e0)
  ;
  SmallVectorBase<char>::begin(local_58);
  __a = (allocator<char> *)SmallVectorBase<char>::end(local_58);
  __end = local_65;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char*,void>(this_00,(char *)in_RDI,(char *)__end,__a);
  std::allocator<char>::~allocator(local_65);
  SmallVector<char,_40UL>::~SmallVector((SmallVector<char,_40UL> *)0x586b27);
  return this_00;
}

Assistant:

std::string SVInt::toString(LiteralBase base, bool includeBase,
                            bitwidth_t abbreviateThresholdBits) const {
    SmallVector<char> buffer;
    writeTo(buffer, base, includeBase, abbreviateThresholdBits);
    return std::string(buffer.begin(), buffer.end());
}